

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O2

AMQP_CONNECTION_HANDLE amqp_connection_create(AMQP_CONNECTION_CONFIG *config)

{
  _Bool _Var1;
  _Bool _Var2;
  void *pvVar3;
  int iVar4;
  UNIQUEID_RESULT UVar5;
  AMQP_CONNECTION_HANDLE conn_handle;
  STRING_HANDLE pSVar6;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  SASL_MECHANISM_HANDLE sasl_mechanism;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE xio;
  LOGGER_LOG p_Var7;
  char *pcVar8;
  CONNECTION_HANDLE connection;
  SESSION_HANDLE session;
  CBS_HANDLE cbs;
  char *pcVar9;
  XIO_HANDLE local_30;
  SASL_MECHANISM_HANDLE local_28;
  
  if (config == (AMQP_CONNECTION_CONFIG *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (AMQP_CONNECTION_HANDLE)0x0;
    }
    pcVar9 = "amqp_connection_create failed (config is NULL)";
    iVar4 = 0x139;
LAB_0013359b:
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
              ,"amqp_connection_create",iVar4,1,pcVar9);
    return (AMQP_CONNECTION_HANDLE)0x0;
  }
  pcVar9 = config->iothub_host_fqdn;
  if (pcVar9 == (char *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (AMQP_CONNECTION_HANDLE)0x0;
    }
    pcVar9 = "amqp_connection_create failed (config->iothub_host_fqdn is NULL)";
    iVar4 = 0x13e;
    goto LAB_0013359b;
  }
  if (config->underlying_io_transport == (XIO_HANDLE)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (AMQP_CONNECTION_HANDLE)0x0;
    }
    pcVar9 = "amqp_connection_create failed (config->underlying_io_transport is NULL)";
    iVar4 = 0x143;
    goto LAB_0013359b;
  }
  conn_handle = (AMQP_CONNECTION_HANDLE)calloc(1,0x60);
  if (conn_handle == (AMQP_CONNECTION_HANDLE)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return (AMQP_CONNECTION_HANDLE)0x0;
    }
    pcVar9 = "amqp_connection_create failed (malloc failed)";
    iVar4 = 0x14c;
    goto LAB_0013359b;
  }
  pSVar6 = STRING_construct(pcVar9);
  conn_handle->iothub_fqdn = pSVar6;
  if (pSVar6 == (STRING_HANDLE)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00133873;
    pcVar9 = "amqp_connection_create failed (STRING_construct failed)";
    iVar4 = 0x155;
  }
  else {
    conn_handle->underlying_io_transport = config->underlying_io_transport;
    conn_handle->is_trace_on = config->is_trace_on;
    pvVar3 = config->on_state_changed_context;
    conn_handle->on_state_changed_callback = config->on_state_changed_callback;
    conn_handle->on_state_changed_context = pvVar3;
    _Var1 = config->create_sasl_io;
    conn_handle->has_sasl_mechanism = _Var1;
    _Var2 = config->create_cbs_connection;
    conn_handle->has_cbs = _Var2;
    conn_handle->svc2cl_keep_alive_timeout_secs = (uint32_t)config->svc2cl_keep_alive_timeout_secs;
    conn_handle->cl2svc_keep_alive_send_ratio = config->cl2svc_keep_alive_send_ratio;
    conn_handle->current_state = AMQP_CONNECTION_STATE_CLOSED;
    if ((_Var1 == false) && (_Var2 == false)) {
      xio = conn_handle->sasl_io;
      if (xio == (XIO_HANDLE)0x0) {
        xio = conn_handle->underlying_io_transport;
      }
LAB_00133692:
      pcVar9 = (char *)calloc(1,0x29);
      if (pcVar9 == (char *)0x0) {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                    ,"create_connection_handle",0xae,1,
                    "Failed creating the AMQP connection (failed creating unique ID container), size:%zu"
                    ,0x29);
        }
      }
      else {
        UVar5 = UniqueId_Generate(pcVar9,0x28);
        if (UVar5 == UNIQUEID_OK) {
          pcVar8 = STRING_c_str(conn_handle->iothub_fqdn);
          connection = connection_create2(xio,pcVar8,pcVar9,(ON_NEW_ENDPOINT)0x0,(void *)0x0,
                                          on_connection_state_changed,conn_handle,
                                          on_connection_io_error,conn_handle);
          conn_handle->connection_handle = connection;
          if (connection == (CONNECTION_HANDLE)0x0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar8 = "Failed creating the AMQP connection (connection_create2 failed)";
              iVar4 = 0xba;
              goto LAB_00133834;
            }
          }
          else {
            iVar4 = connection_set_idle_timeout
                              (connection,conn_handle->svc2cl_keep_alive_timeout_secs * 1000);
            if (iVar4 == 0) {
              iVar4 = connection_set_remote_idle_timeout_empty_frame_send_ratio
                                (conn_handle->connection_handle,
                                 conn_handle->cl2svc_keep_alive_send_ratio);
              if (iVar4 == 0) {
                connection_set_trace(conn_handle->connection_handle,conn_handle->is_trace_on);
                free(pcVar9);
                session = session_create(conn_handle->connection_handle,(ON_LINK_ATTACHED)0x0,
                                         (void *)0x0);
                conn_handle->session_handle = session;
                if (session == (SESSION_HANDLE)0x0) {
                  p_Var7 = xlogging_get_log_function();
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    (*p_Var7)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                              ,"create_session_handle",0xdd,1,
                              "Failed creating the AMQP connection (connection_create2 failed)");
                  }
                  p_Var7 = xlogging_get_log_function();
                  if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00133873;
                  pcVar9 = "amqp_connection_create failed (failed creating the AMQP session)";
                  iVar4 = 0x172;
                  goto LAB_0013386e;
                }
                iVar4 = session_set_incoming_window(session,0xffffffff);
                if ((iVar4 != 0) &&
                   (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
                  (*p_Var7)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                            ,"create_session_handle",0xe3,1,
                            "Failed to set the AMQP session incoming window size.");
                }
                iVar4 = session_set_outgoing_window(conn_handle->session_handle,100);
                if ((iVar4 != 0) &&
                   (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
                  (*p_Var7)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                            ,"create_session_handle",0xe8,1,
                            "Failed to set the AMQP session outgoing window size.");
                }
                if (config->create_cbs_connection != true) {
                  return conn_handle;
                }
                cbs = cbs_create(conn_handle->session_handle);
                conn_handle->cbs_handle = cbs;
                if (cbs == (CBS_HANDLE)0x0) {
                  p_Var7 = xlogging_get_log_function();
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    pcVar9 = "Failed to create the CBS connection.";
                    iVar4 = 0xf8;
                    goto LAB_00133a4e;
                  }
                }
                else {
                  iVar4 = cbs_open_async(cbs,on_cbs_open_complete,conn_handle,on_cbs_error,
                                         conn_handle);
                  if (iVar4 == 0) {
                    return conn_handle;
                  }
                  p_Var7 = xlogging_get_log_function();
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    pcVar9 = "Failed to open the connection with CBS.";
                    iVar4 = 0xfd;
LAB_00133a4e:
                    (*p_Var7)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                              ,"create_cbs_handle",iVar4,1,pcVar9);
                  }
                }
                p_Var7 = xlogging_get_log_function();
                if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00133873;
                pcVar9 = "amqp_connection_create failed (failed creating the CBS handle)";
                iVar4 = 0x177;
                goto LAB_0013386e;
              }
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar8 = 
                "Failed creating the AMQP connection (connection_set_remote_idle_timeout_empty_frame_send_ratio)"
                ;
                iVar4 = 0xc4;
                goto LAB_00133834;
              }
            }
            else {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar8 = "Failed creating the AMQP connection (connection_set_idle_timeout failed)";
                iVar4 = 0xbf;
                goto LAB_00133834;
              }
            }
          }
        }
        else {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar8 = "Failed creating the AMQP connection (UniqueId_Generate failed)";
            iVar4 = 0xb5;
LAB_00133834:
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                      ,"create_connection_handle",iVar4,1,pcVar8);
          }
        }
      }
      free(pcVar9);
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00133873;
      pcVar9 = "amqp_connection_create failed (failed creating the AMQP connection)";
      iVar4 = 0x16d;
    }
    else {
      sasl_mechanism_interface_description = saslmssbcbs_get_interface();
      sasl_mechanism = saslmechanism_create(sasl_mechanism_interface_description,(void *)0x0);
      if (sasl_mechanism == (SASL_MECHANISM_HANDLE)0x0) {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                    ,"create_sasl_components",0x37,1,
                    "Failed creating the SASL mechanism (saslmechanism_create failed)");
        }
      }
      else {
        local_30 = conn_handle->underlying_io_transport;
        local_28 = sasl_mechanism;
        io_interface_description = saslclientio_get_interface_description();
        xio = xio_create(io_interface_description,&local_30);
        if (xio == (XIO_HANDLE)0x0) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                      ,"create_sasl_components",0x42,1,
                      "Failed creating the SASL I/O (xio_create failed)");
          }
        }
        else {
          iVar4 = xio_setoption(xio,"logtrace",&conn_handle->is_trace_on);
          if (iVar4 == 0) {
            conn_handle->sasl_mechanism = sasl_mechanism;
            conn_handle->sasl_io = xio;
            goto LAB_00133692;
          }
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                      ,"create_sasl_components",0x48,1,
                      "Failed setting the SASL I/O logging trace option (xio_setoption failed)");
          }
          xio_destroy(xio);
        }
        saslmechanism_destroy(sasl_mechanism);
      }
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00133873;
      pcVar9 = "amqp_connection_create failed (failed creating the SASL components)";
      iVar4 = 0x168;
    }
  }
LAB_0013386e:
  (*p_Var7)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
            ,"amqp_connection_create",iVar4,1,pcVar9);
LAB_00133873:
  amqp_connection_destroy(conn_handle);
  return (AMQP_CONNECTION_HANDLE)0x0;
}

Assistant:

AMQP_CONNECTION_HANDLE amqp_connection_create(AMQP_CONNECTION_CONFIG* config)
{
    AMQP_CONNECTION_HANDLE result;

    if (config == NULL)
    {
        result = NULL;
        LogError("amqp_connection_create failed (config is NULL)");
    }
    else if (config->iothub_host_fqdn == NULL)
    {
        result = NULL;
        LogError("amqp_connection_create failed (config->iothub_host_fqdn is NULL)");
    }
    else if (config->underlying_io_transport == NULL)
    {
        result = NULL;
        LogError("amqp_connection_create failed (config->underlying_io_transport is NULL)");
    }
    else
    {
        AMQP_CONNECTION_INSTANCE* instance;

        if ((instance = (AMQP_CONNECTION_INSTANCE*)malloc(sizeof(AMQP_CONNECTION_INSTANCE))) == NULL)
        {
            result = NULL;
            LogError("amqp_connection_create failed (malloc failed)");
        }
        else
        {
            memset(instance, 0, sizeof(AMQP_CONNECTION_INSTANCE));

            if ((instance->iothub_fqdn = STRING_construct(config->iothub_host_fqdn)) == NULL)
            {
                result = NULL;
                LogError("amqp_connection_create failed (STRING_construct failed)");
            }
            else
            {
                instance->underlying_io_transport = config->underlying_io_transport;
                instance->is_trace_on = config->is_trace_on;
                instance->on_state_changed_callback = config->on_state_changed_callback;
                instance->on_state_changed_context = config->on_state_changed_context;
                instance->has_sasl_mechanism = config->create_sasl_io;
                instance->has_cbs = config->create_cbs_connection;

                instance->svc2cl_keep_alive_timeout_secs = (uint32_t)config->svc2cl_keep_alive_timeout_secs;
                instance->cl2svc_keep_alive_send_ratio = (double)config->cl2svc_keep_alive_send_ratio;

                instance->current_state = AMQP_CONNECTION_STATE_CLOSED;

                if ((config->create_sasl_io || config->create_cbs_connection) && create_sasl_components(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the SASL components)");
                }
                else if (create_connection_handle(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the AMQP connection)");
                }
                else if (create_session_handle(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the AMQP session)");
                }
                else if (config->create_cbs_connection && create_cbs_handle(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the CBS handle)");
                }
                else
                {
                    result = (AMQP_CONNECTION_HANDLE)instance;
                }
            }

            if (result == NULL)
            {
                amqp_connection_destroy((AMQP_CONNECTION_HANDLE)instance);
            }
        }
    }

    return result;
}